

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Stream Catch::createStream(string *streamName)

{
  int iVar1;
  streambuf *psVar2;
  long *plVar3;
  domain_error *this;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  Stream SVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = std::__cxx11::string::compare((char *)streamName);
  if (iVar1 == 0) {
    plVar3 = &std::cout;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)streamName);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)streamName);
      if (iVar1 != 0) {
        this = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_38,"Unknown stream: ",streamName);
        std::domain_error::domain_error(this,(string *)&bStack_38);
        __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      psVar2 = (streambuf *)operator_new(0x148);
      *(code **)psVar2 = sysconf;
      *(undefined8 *)(psVar2 + 8) = 0;
      *(undefined8 *)(psVar2 + 0x10) = 0;
      *(undefined8 *)(psVar2 + 0x18) = 0;
      *(undefined8 *)(psVar2 + 0x20) = 0;
      *(undefined8 *)(psVar2 + 0x28) = 0;
      *(undefined8 *)(psVar2 + 0x30) = 0;
      std::locale::locale((locale *)(psVar2 + 0x38));
      *(undefined ***)psVar2 = &PTR__StreamBufImpl_0018c550;
      *(streambuf **)(psVar2 + 0x28) = psVar2 + 0x40;
      *(streambuf **)(psVar2 + 0x20) = psVar2 + 0x40;
      *(streambuf **)(psVar2 + 0x30) = psVar2 + 0x140;
      uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00137efd;
    }
    plVar3 = &std::cerr;
  }
  psVar2 = *(streambuf **)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0xe8);
  uVar4 = 0;
LAB_00137efd:
  SVar5._8_8_ = uVar4;
  SVar5.streamBuf = psVar2;
  return SVar5;
}

Assistant:

Stream createStream( std::string const& streamName ) {
        if( streamName == "stdout" ) return Stream( std::cout.rdbuf(), false );
        if( streamName == "stderr" ) return Stream( std::cerr.rdbuf(), false );
        if( streamName == "debug" ) return Stream( new StreamBufImpl<OutputDebugWriter>, true );

        throw std::domain_error( "Unknown stream: " + streamName );
    }